

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fade_group.cpp
# Opt level: O1

Am_Style clear_halftone(int percent)

{
  Am_Style *this;
  bool bVar1;
  int iVar2;
  ulong uVar3;
  uint in_ESI;
  undefined4 in_register_0000003c;
  long lVar4;
  Am_Style local_30;
  Am_Style local_28;
  
  uVar3 = 0;
  if (0 < (int)in_ESI) {
    uVar3 = (ulong)in_ESI;
  }
  if (clear_halftone(int)::halftone_array == '\0') {
    iVar2 = __cxa_guard_acquire(&clear_halftone(int)::halftone_array);
    if (iVar2 != 0) {
      lVar4 = 0;
      do {
        Am_Style::Am_Style((Am_Style *)(clear_halftone(int)::halftone_array + lVar4));
        lVar4 = lVar4 + 8;
      } while (lVar4 != 800);
      __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
      __cxa_guard_release(&clear_halftone(int)::halftone_array);
    }
  }
  this = (Am_Style *)(clear_halftone(int)::halftone_array + uVar3 * 8);
  bVar1 = Am_Style::Valid(this);
  if (!bVar1) {
    Am_Style::Halftone_Stipple(&local_28,(int)uVar3,Am_FILL_STIPPLED);
    Am_Style::Clone_With_New_Color(&local_30,&local_28);
    Am_Style::operator=(this,&local_30);
    Am_Style::~Am_Style(&local_30);
    Am_Style::~Am_Style(&local_28);
  }
  Am_Style::Am_Style((Am_Style *)CONCAT44(in_register_0000003c,percent),this);
  return (Am_Style)(Am_Style_Data *)CONCAT44(in_register_0000003c,percent);
}

Assistant:

static Am_Style
clear_halftone(int percent)
{
  if (percent < 0)
    percent = 0;
  else if (percent > 99)
    percent = 99;
  static Am_Style halftone_array[100];
  if (!halftone_array[percent].Valid())
    halftone_array[percent] =
        Am_Style::Halftone_Stipple(percent).Clone_With_New_Color(Am_Off_Bits);
  return halftone_array[percent];
}